

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spritesheet.cpp
# Opt level: O3

bool __thiscall
Rml::SpritesheetList::AddSpriteSheet
          (SpritesheetList *this,String *name,String *image_source,String *definition_source,
          int definition_line_number,float display_scale,SpriteDefinitionList *sprite_definitions)

{
  pointer ppVar1;
  pointer pcVar2;
  Vector2Type VVar3;
  element_type *peVar4;
  type pSVar5;
  String *pSVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>
  *sprite_definition;
  pointer key;
  int definition_line_number_local;
  String *local_60;
  shared_ptr<const_Rml::Spritesheet> local_58;
  SharedPtr<Rml::Spritesheet> sprite_sheet_ptr;
  float display_scale_local;
  
  sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  definition_line_number_local = definition_line_number;
  local_60 = definition_source;
  display_scale_local = display_scale;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::Spritesheet,std::allocator<Rml::Spritesheet>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int&,float&>
            (&sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Spritesheet **)&sprite_sheet_ptr,(allocator<Rml::Spritesheet> *)&local_58
             ,name,image_source,definition_source,&definition_line_number_local,&display_scale_local
            );
  peVar4 = sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<const_Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<const_Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
  ::emplace_back<std::shared_ptr<Rml::Spritesheet_const>>
            ((vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
              *)this,&local_58);
  if (local_58.super___shared_ptr<const_Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->sprite_map,
            ((long)(sprite_definitions->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(sprite_definitions->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
            (this->sprite_map).mNumElements);
  ppVar1 = (sprite_definitions->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (key = (sprite_definitions->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Rectangle<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; key != ppVar1; key = key + 1) {
    pSVar5 = robin_hood::detail::
             Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::doCreateByKey<std::__cxx11::string_const&,Rml::Sprite>
                       ((Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)&this->sprite_map,&key->first);
    if (pSVar5->sprite_sheet != (Spritesheet *)0x0) {
      pcVar2 = (key->first)._M_dataplus._M_p;
      pSVar6 = TextureSource::GetDefinitionSource_abi_cxx11_(&pSVar5->sprite_sheet->texture_source);
      Log::Message(LT_WARNING,
                   "Sprite \'%s\' was overwritten due to duplicate names at the same block scope. Declared at %s:%d and %s:%d"
                   ,pcVar2,(pSVar6->_M_dataplus)._M_p,
                   (ulong)(uint)pSVar5->sprite_sheet->definition_line_number,
                   (local_60->_M_dataplus)._M_p,(ulong)(uint)definition_line_number_local);
    }
    VVar3 = (key->second).p1;
    (pSVar5->rectangle).p0 = (key->second).p0;
    (pSVar5->rectangle).p1 = VVar3;
    pSVar5->sprite_sheet = peVar4;
  }
  if (sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sprite_sheet_ptr.super___shared_ptr<Rml::Spritesheet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool SpritesheetList::AddSpriteSheet(const String& name, const String& image_source, const String& definition_source, int definition_line_number,
	float display_scale, const SpriteDefinitionList& sprite_definitions)
{
	auto sprite_sheet_ptr = MakeShared<Spritesheet>(name, image_source, definition_source, definition_line_number, display_scale);
	Spritesheet* sprite_sheet = sprite_sheet_ptr.get();
	spritesheets.push_back(std::move(sprite_sheet_ptr));

	sprite_map.reserve(sprite_map.size() + sprite_definitions.size());

	// Insert all the sprites, overwriting any existing sprites already defined in the current media block scope.
	for (auto& sprite_definition : sprite_definitions)
	{
		const String& sprite_name = sprite_definition.first;
		const Rectanglef& sprite_rectangle = sprite_definition.second;

		Sprite& new_sprite = sprite_map[sprite_name];
		if (new_sprite.sprite_sheet)
		{
			Log::Message(Log::LT_WARNING, "Sprite '%s' was overwritten due to duplicate names at the same block scope. Declared at %s:%d and %s:%d",
				sprite_name.c_str(), new_sprite.sprite_sheet->texture_source.GetDefinitionSource().c_str(),
				new_sprite.sprite_sheet->definition_line_number, definition_source.c_str(), definition_line_number);
		}

		new_sprite = Sprite{sprite_rectangle, sprite_sheet};
	}

	return true;
}